

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.hpp
# Opt level: O1

int njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 *puVar3;
  ref_view<const_std::vector<double,_std::allocator<double>_>_> local_30;
  ref_view<const_std::vector<double,_std::allocator<double>_>_> local_28;
  undefined7 extraout_var;
  
  if ((*(long *)(ctx + 0x68) - *(long *)(ctx + 0x60) ==
       *(long *)(sig + 0x68) - *(long *)(sig + 0x60)) &&
     (*(long *)(ctx + 0x38) - *(long *)(ctx + 0x30) == *(long *)(sig + 0x38) - *(long *)(sig + 0x30)
     )) {
    local_28.rng_ = (vector<double,_std::allocator<double>_> *)(ctx + 0x30);
    local_30.rng_ = (vector<double,_std::allocator<double>_> *)(sig + 0x30);
    bVar1 = Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
            compare<ranges::ref_view<std::vector<long,std::allocator<long>>const>>
                      ((ref_view<const_std::vector<long,_std::allocator<long>_>_> *)&local_28,
                       (ref_view<const_std::vector<long,_std::allocator<long>_>_> *)&local_30);
    if (!bVar1) {
      tools::Log::error<char_const*>
                ("Encountered different interpolation ranges between the real and imaginary parts");
    }
    local_28.rng_ = (vector<double,_std::allocator<double>_> *)(ctx + 0x48);
    local_30.rng_ = (vector<double,_std::allocator<double>_> *)(sig + 0x48);
    bVar1 = Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
            compare<ranges::ref_view<std::vector<long,std::allocator<long>>const>>
                      ((ref_view<const_std::vector<long,_std::allocator<long>_>_> *)&local_28,
                       (ref_view<const_std::vector<long,_std::allocator<long>_>_> *)&local_30);
    if (!bVar1) {
      tools::Log::error<char_const*>
                ("Encountered different interpolation schemes between the real and imaginary parts")
      ;
    }
    local_30.rng_ = (vector<double,_std::allocator<double>_> *)(sig + 0x60);
    local_28.rng_ = (vector<double,_std::allocator<double>_> *)(ctx + 0x60);
    bVar1 = Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
            compare<ranges::ref_view<std::vector<double,std::allocator<double>>const>>
                      (&local_28,&local_30);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      tools::Log::error<char_const*>
                ("Encountered different energies between the real and imaginary parts");
      iVar2 = extraout_EAX;
    }
    return iVar2;
  }
  tools::Log::error<char_const*>("Encountered inconsistent size for real and imaginary values");
  tools::Log::info<char_const*,long>
            ("real.NR: {}",*(long *)(ctx + 0x38) - *(long *)(ctx + 0x30) >> 3);
  tools::Log::info<char_const*,long>
            ("imaginary.NR: {}",*(long *)(sig + 0x38) - *(long *)(sig + 0x30) >> 3);
  tools::Log::info<char_const*,long>
            ("real.NP: {}",*(long *)(ctx + 0x68) - *(long *)(ctx + 0x60) >> 3);
  tools::Log::info<char_const*,long>
            ("imaginary.NP: {}",*(long *)(sig + 0x68) - *(long *)(sig + 0x60) >> 3);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verify( const TabulationRecord& real, const TabulationRecord& imaginary ) {

  if ( ( real.NP() != imaginary.NP() ) || ( real.NR() != imaginary.NR() ) ) {

    Log::error( "Encountered inconsistent size for real and imaginary values" );
    Log::info( "real.NR: {}", real.NR() );
    Log::info( "imaginary.NR: {}", imaginary.NR() );
    Log::info( "real.NP: {}", real.NP() );
    Log::info( "imaginary.NP: {}", imaginary.NP() );
    throw std::exception();
  }

  if ( !compare( real.boundaries(), imaginary.boundaries() ) ) {

    Log::error( "Encountered different interpolation ranges between the real "
                "and imaginary parts" );
  }

  if ( !compare( real.interpolants(), imaginary.interpolants() ) ) {

    Log::error( "Encountered different interpolation schemes between the real "
                "and imaginary parts" );
  }

  if ( !compare( real.x(), imaginary.x() ) ) {

    Log::error( "Encountered different energies between the real and "
                "imaginary parts" );
  }
}